

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha-1.c
# Opt level: O0

uchar * lws_SHA1(uchar *d,size_t n,uchar *md)

{
  undefined1 local_88 [8];
  sha1_ctxt ctx;
  uchar *md_local;
  size_t n_local;
  uchar *d_local;
  
  ctx._96_8_ = md;
  _sha1_init((sha1_ctxt *)local_88);
  sha1_loop((sha1_ctxt *)local_88,d,n);
  sha1_result((sha1_ctxt *)local_88,(void *)ctx._96_8_);
  return (uchar *)ctx._96_8_;
}

Assistant:

unsigned char *
lws_SHA1(const unsigned char *d, size_t n, unsigned char *md)
{
	struct sha1_ctxt ctx;

	_sha1_init(&ctx);
	sha1_loop(&ctx, d, n);
	sha1_result(&ctx, (void *)md);

	return md;
}